

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

uint64_t hash_string(char *string,size_t length)

{
  undefined8 local_30;
  size_t i;
  uint64_t hash;
  uchar *str;
  size_t length_local;
  char *string_local;
  
  i = 0;
  hash = (uint64_t)string;
  for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
    i = (ulong)*(byte *)hash ^ i * 0x100000001b3;
    hash = hash + 1;
  }
  return i;
}

Assistant:

uint64_t hash_string(char *string, size_t length) {
	// Convert to an unsigned string
	unsigned char *str = (unsigned char *) string;

	// Hash each byte of the string
	uint64_t hash = 0;
	for (size_t i = 0; i < length; i++) {
		// Multiply by the magic prime, modulo 2^64 from integer overflow
		hash *= FNV_64_PRIME;

		// XOR the lowest byte of the hash with the current octet
		hash ^= (uint64_t) *str++;
	}

	return hash;
}